

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void writeBPMatrix(Manager *manager,int puzNum,int rowNum,int colNum)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long local_258;
  ofstream file;
  ios_base local_160 [264];
  ulong local_58;
  Manager *local_50;
  int local_48;
  int local_44;
  ulong local_40;
  uint local_34;
  
  local_48 = puzNum;
  local_34 = colNum;
  std::ofstream::ofstream(&local_258,"bpgMatrix.txt",_S_out);
  local_50 = manager;
  if ((manager->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (manager->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_58 = (ulong)(uint)rowNum;
    uVar6 = (ulong)local_34;
    local_40 = 0;
    local_44 = rowNum;
    do {
      iVar2 = local_44;
      plVar3 = (long *)std::ostream::operator<<((ostream *)&local_258,local_48);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_258,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      plVar3 = (long *)std::ostream::operator<<(poVar4,local_34);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      uVar5 = local_40;
      if (0 < iVar2) {
        uVar8 = 0;
        do {
          if (0 < (int)local_34) {
            lVar7 = 0;
            do {
              lVar1 = *(long *)(*(long *)&(local_50->puzzles).
                                          super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                                          super__Vector_impl_data._M_start[uVar5].matrix.
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               + uVar8 * 0x18);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_258,*(char **)(lVar1 + lVar7),
                                  *(long *)(lVar1 + 8 + lVar7));
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
              lVar7 = lVar7 + 0x20;
            } while (uVar6 << 5 != lVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\n",1);
          uVar8 = uVar8 + 1;
        } while (uVar8 != local_58);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\n\n\n",3);
      local_40 = local_40 + 1;
      uVar5 = ((long)(local_50->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(local_50->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    } while (local_40 <= uVar5 && uVar5 - local_40 != 0);
  }
  std::ofstream::close();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"File saved sucessfully! ;)",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  local_258 = _VTT;
  *(undefined8 *)((long)&local_258 + *(long *)(_VTT + -0x18)) = __filebuf;
  std::filebuf::~filebuf((filebuf *)&file);
  std::ios_base::~ios_base(local_160);
  return;
}

Assistant:

void writeBPMatrix( Manager manager, int puzNum, int rowNum, int colNum )
{
	std::ofstream file("bpgMatrix.txt");
	
    for( int vec = 0; vec < manager.puzzles.size(); vec++ )
    {
	      file << puzNum << std::endl;

	      file << rowNum
		    << " "
		    << colNum
		    << std::endl;
        for ( int i = 0; i < rowNum; i++)
        {
		        for( int j = 0; j < colNum; j++ )
            {
                file << manager.puzzles[vec].matrix[i][j] << "  ";
            }

            file << "\n";
        }

        file << "\n\n\n";
    }

	file.close();

	std::cout << "File saved sucessfully! ;)" << std::endl;
}